

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

void __thiscall
CVmObjTable::for_each(CVmObjTable *this,_func_void_vm_obj_id_t_void_ptr *func,void *ctx)

{
  CVmObjPageEntry *pCVar1;
  CVmObjPageEntry **ppCVar2;
  vm_obj_id_t vVar3;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  
  ppCVar2 = this->pages_;
  sVar4 = this->pages_used_;
  vVar3 = 0;
  while (bVar6 = sVar4 != 0, sVar4 = sVar4 - 1, bVar6) {
    pCVar1 = *ppCVar2;
    for (lVar5 = -0x18000; lVar5 != 0; lVar5 = lVar5 + 0x18) {
      if (((&pCVar1[0x1000].field_0x14)[lVar5] & 1) == 0) {
        (*func)(vVar3,ctx);
      }
      vVar3 = vVar3 + 1;
    }
    ppCVar2 = ppCVar2 + 1;
  }
  return;
}

Assistant:

void CVmObjTable::for_each(VMG_ void (*func)(VMG_ vm_obj_id_t, void *),
                           void *ctx)
{
    CVmObjPageEntry **pg;
    size_t i;
    vm_obj_id_t id;

    /* go through each page in the object table */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* start at the start of the page */
        size_t j = VM_OBJ_PAGE_CNT;
        CVmObjPageEntry *entry = *pg;

        /* go through each entry on this page */
        for ( ; j > 0 ; --j, ++entry, ++id)
        {
            /* if this entry is in use, invoke the callback */
            if (!entry->free_)
                (*func)(vmg_ id, ctx);
        }
    }
}